

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O2

void luabridge::detail::CFunc::addGetter(lua_State *L,char *name,int tableIndex)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  iVar1 = lua_type(L,tableIndex);
  if (iVar1 == 5) {
    iVar1 = lua_iscfunction(L,-1);
    if (iVar1 != 0) {
      lua_rawgetp(L,tableIndex,(void *)0x6e7);
      lua_pushvalue(L,-2);
      rawsetfield(L,-2,name);
      lua_settop(L,-3);
      return;
    }
    __assertion = "lua_iscfunction(L, -1)";
    __line = 0x18;
  }
  else {
    __assertion = "lua_istable(L, tableIndex)";
    __line = 0x17;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                ,__line,
                "static void luabridge::detail::CFunc::addGetter(lua_State *, const char *, int)");
}

Assistant:

static void addGetter(lua_State* L, const char* name, int tableIndex)
    {
        assert(lua_istable(L, tableIndex));
        assert(lua_iscfunction(L, -1)); // Stack: getter

        lua_rawgetp(L, tableIndex, getPropgetKey()); // Stack: getter, propget table (pg)
        lua_pushvalue(L, -2); // Stack: getter, pg, getter
        rawsetfield(L, -2, name); // Stack: getter, pg
        lua_pop(L, 2); // Stack: -
    }